

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_append_entries.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::request_append_entries(raft_server *this)

{
  int32 iVar1;
  uint64_t target_idx;
  __node_base *p_Var2;
  __shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  if ((this->peers_)._M_h._M_element_count != 0) {
    iVar1 = get_quorum_for_commit(this);
    if (iVar1 != 0) {
      p_Var2 = &(this->peers_)._M_h._M_before_begin;
      while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
        std::__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_30,(__shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2> *)(p_Var2 + 2))
        ;
        request_append_entries(this,(ptr<peer> *)&local_30);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
      }
      return;
    }
  }
  target_idx = get_current_leader_index(this);
  commit(this,target_idx);
  return;
}

Assistant:

void raft_server::request_append_entries() {
    // Special case:
    //   1) one-node cluster, OR
    //   2) quorum size == 1 (including leader).
    //
    // In those cases, we may not enter `handle_append_entries_resp`,
    // which calls `commit()` function.
    // We should call it here.
    if ( peers_.size() == 0 ||
         get_quorum_for_commit() == 0 ) {
        uint64_t leader_index = get_current_leader_index();
        commit(leader_index);
        return;
    }

    for (peer_itor it = peers_.begin(); it != peers_.end(); ++it) {
        request_append_entries(it->second);
    }
}